

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRoundItem.h
# Opt level: O2

void __thiscall
TimeRoundItem<channel>::TimeRoundItem
          (TimeRoundItem<channel> *this,int _time_threod,Fun *_fun,shared_ptr<channel> *_ptr)

{
  this->time_threod = _time_threod;
  std::function<void_()>::function(&this->fun,_fun);
  std::__shared_ptr<channel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->ptr).super___shared_ptr<channel,_(__gnu_cxx::_Lock_policy)2>,
             &_ptr->super___shared_ptr<channel,_(__gnu_cxx::_Lock_policy)2>);
  this->index = 0;
  return;
}

Assistant:

TimeRoundItem(int _time_threod,Fun _fun,std::shared_ptr<T> _ptr):
        time_threod(_time_threod),fun(_fun),ptr(_ptr)
        {
            index = 0;
        }